

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgt_save_png(djg_texture *texture,char *filename)

{
  djg_texture *pdVar1;
  int iVar2;
  djg_texture *pdVar3;
  ulong uVar4;
  char buf [1024];
  char acStack_438 [1032];
  
  pdVar1 = texture->next;
  if (pdVar1 != (djg_texture *)0x0) {
    iVar2 = 1;
    pdVar3 = pdVar1;
    do {
      pdVar3 = pdVar3->next;
      iVar2 = iVar2 + -1;
    } while (pdVar3 != (djg_texture *)0x0);
    if (iVar2 == 0) {
      sprintf(acStack_438,"%s.png",filename);
      iVar2 = stbi_write_png(acStack_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels,0);
      return iVar2 != 0;
    }
    if (pdVar1 != (djg_texture *)0x0) {
      uVar4 = 1;
      do {
        sprintf(acStack_438,"%s_layer%03i.png",filename,uVar4);
        uVar4 = (ulong)((int)uVar4 + 1);
        iVar2 = stbi_write_png(acStack_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels,0);
      } while (iVar2 != 0);
      return false;
    }
  }
  return true;
}

Assistant:

DJGDEF bool djgt_save_png(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.png", filename);

        return stbi_write_png(buf, it->x, it->y, it->comp, it->texels, 0);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.png", filename, i);

            ++i;
            if (!stbi_write_png(buf, it->x, it->y, it->comp, it->texels, 0))
                return false;
        }
    }

    return true;
}